

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O0

bool testLoadUnstructuredL2(bool verbose,int gpu_id)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  bool local_e1;
  bool local_c1;
  int local_8c;
  int local_88;
  bool local_69;
  bool magma_pass;
  bool cuda_pass;
  int local_2c;
  bool cublas_pass;
  int gpu;
  int gpu_end;
  int gpu_begin;
  bool local_11;
  bool blas_pass;
  bool pass;
  int gpu_id_local;
  bool verbose_local;
  
  bVar1 = TasGrid::AccelerationMeta::isAvailable(accel_cpu_blas);
  if (bVar1) {
    local_69 = runTests(accel_cpu_blas,verbose,0);
  }
  else {
    local_69 = true;
  }
  if (local_69 == false) {
    std::operator<<((ostream *)&std::cout,"Failed testLoadUnstructuredL2() blas case.\n");
  }
  else if (verbose) {
    _Var2 = std::setw(10);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"blas   ");
    _Var2 = std::setw(0x1e);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3,"unstructured construction");
    _Var2 = std::setw(10);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3,"Pass");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_11 = local_69;
  bVar1 = TasGrid::AccelerationMeta::isAvailable(accel_gpu_cuda);
  if (bVar1) {
    if (gpu_id == -1) {
      local_88 = 0;
      local_8c = TasGrid::TasmanianSparseGrid::getNumGPUs();
      local_2c = local_88;
    }
    else {
      local_8c = gpu_id + 1;
      local_2c = gpu_id;
    }
    for (; local_2c < local_8c; local_2c = local_2c + 1) {
      bVar1 = runTests(accel_gpu_cublas,verbose,local_2c);
      if (bVar1) {
        if (verbose) {
          _Var2 = std::setw(7);
          poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
          poVar3 = std::operator<<(poVar3,"cublas");
          _Var2 = std::setw(3);
          poVar3 = std::operator<<(poVar3,_Var2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
          _Var2 = std::setw(0x1e);
          poVar3 = std::operator<<(poVar3,_Var2);
          poVar3 = std::operator<<(poVar3,"unstructured construction");
          _Var2 = std::setw(10);
          poVar3 = std::operator<<(poVar3,_Var2);
          poVar3 = std::operator<<(poVar3,"Pass");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Failed testLoadUnstructuredL2() cublas case on device ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
        std::operator<<(poVar3,"\n");
      }
      bVar1 = runTests(accel_gpu_cuda,verbose,local_2c);
      if (bVar1) {
        if (verbose) {
          _Var2 = std::setw(7);
          poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
          poVar3 = std::operator<<(poVar3,"cuda");
          _Var2 = std::setw(3);
          poVar3 = std::operator<<(poVar3,_Var2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
          _Var2 = std::setw(0x1e);
          poVar3 = std::operator<<(poVar3,_Var2);
          poVar3 = std::operator<<(poVar3,"unstructured construction");
          _Var2 = std::setw(10);
          poVar3 = std::operator<<(poVar3,_Var2);
          poVar3 = std::operator<<(poVar3,"Pass");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Failed testLoadUnstructuredL2() cuda case on device ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
        std::operator<<(poVar3,"\n");
      }
      local_c1 = false;
      if (local_11 != false) {
        local_c1 = bVar1;
      }
      local_11 = local_c1;
      bVar1 = TasGrid::AccelerationMeta::isAvailable(accel_gpu_magma);
      if (bVar1) {
        bVar1 = runTests(accel_gpu_magma,verbose,local_2c);
        if (bVar1) {
          if (verbose) {
            _Var2 = std::setw(7);
            poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
            poVar3 = std::operator<<(poVar3,"magma");
            _Var2 = std::setw(3);
            poVar3 = std::operator<<(poVar3,_Var2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
            _Var2 = std::setw(0x1e);
            poVar3 = std::operator<<(poVar3,_Var2);
            poVar3 = std::operator<<(poVar3,"unstructured construction");
            _Var2 = std::setw(10);
            poVar3 = std::operator<<(poVar3,_Var2);
            poVar3 = std::operator<<(poVar3,"Pass");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "Failed testLoadUnstructuredL2() magma case on device ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
          std::operator<<(poVar3,"\n");
        }
        local_e1 = false;
        if (local_c1 != false) {
          local_e1 = bVar1;
        }
        local_11 = local_e1;
      }
    }
  }
  if (((verbose) && (bVar1 = TasGrid::AccelerationMeta::isAvailable(accel_cpu_blas), !bVar1)) &&
     (bVar1 = TasGrid::AccelerationMeta::isAvailable(accel_gpu_cuda), !bVar1)) {
    std::operator<<((ostream *)&std::cout,"testLoadUnstructuredL2() requires BLAS or CUDA\n");
  }
  return local_11;
}

Assistant:

bool testLoadUnstructuredL2(bool verbose, int gpu_id){
    #ifdef Tasmanian_ENABLE_DPCPP
    test_queue.init_testing(gpu_id);
    #endif
    bool pass = true;

    bool blas_pass = (AccelerationMeta::isAvailable(accel_cpu_blas)) ? runTests(accel_cpu_blas, verbose, 0) : true;
    if (blas_pass){
        if (verbose) cout << std::setw(10) << "blas   " << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
    }else{
        cout << "Failed testLoadUnstructuredL2() blas case.\n";
    }
    pass = pass and blas_pass;

    if (AccelerationMeta::isAvailable(accel_gpu_cuda)){
        int gpu_begin = (gpu_id == -1) ? 0 : gpu_id;
        int gpu_end   = (gpu_id == -1) ? TasmanianSparseGrid::getNumGPUs() : gpu_id + 1;
        for(int gpu = gpu_begin; gpu < gpu_end; gpu++){
            bool cublas_pass = runTests(accel_gpu_cublas, verbose, gpu);
            if (cublas_pass){
                if (verbose) cout << std::setw(7) << "cublas" << std::setw(3) << gpu << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
            }else{
                cout << "Failed testLoadUnstructuredL2() cublas case on device " << gpu << "\n";
            }
            bool cuda_pass = runTests(accel_gpu_cuda, verbose, gpu);
            if (cuda_pass){
                if (verbose) cout << std::setw(7) << "cuda" << std::setw(3) << gpu << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
            }else{
                cout << "Failed testLoadUnstructuredL2() cuda case on device " << gpu << "\n";
            }
            pass = pass and cuda_pass;
            if (AccelerationMeta::isAvailable(accel_gpu_magma)){
                bool magma_pass = runTests(accel_gpu_magma, verbose, gpu);
                if (magma_pass){
                    if (verbose) cout << std::setw(7) << "magma" << std::setw(3) << gpu
                                      << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
                }else{
                    cout << "Failed testLoadUnstructuredL2() magma case on device " << gpu << "\n";
                }
                pass = pass and magma_pass;
            }
        }
    }

    if (verbose and not AccelerationMeta::isAvailable(accel_cpu_blas) and not AccelerationMeta::isAvailable(accel_gpu_cuda))
        cout << "testLoadUnstructuredL2() requires BLAS or CUDA\n";

    return pass;
}